

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# thread_common.c
# Opt level: O3

void lr_sync_read(void *lr_sync,int r,int c,int plane)

{
  long lVar1;
  int iVar2;
  long lVar3;
  pthread_mutex_t *__mutex;
  
  if ((r != 0) && (iVar2 = *(int *)((long)lr_sync + 0x48), (iVar2 - 1U & c) == 0)) {
    lVar3 = (long)plane;
    lVar1 = (long)r + -1;
    __mutex = (pthread_mutex_t *)(lVar1 * 0x28 + *(long *)((long)lr_sync + lVar3 * 8));
    pthread_mutex_lock(__mutex);
    if (*(int *)(*(long *)((long)lr_sync + lVar3 * 8 + 0x30) + -4 + (long)r * 4) - iVar2 < c) {
      do {
        pthread_cond_wait((pthread_cond_t *)
                          (*(long *)((long)lr_sync + lVar3 * 8 + 0x18) + lVar1 * 0x30),__mutex);
      } while (*(int *)(*(long *)((long)lr_sync + lVar3 * 8 + 0x30) + lVar1 * 4) - iVar2 < c);
    }
    pthread_mutex_unlock(__mutex);
    return;
  }
  return;
}

Assistant:

static inline void lr_sync_read(void *const lr_sync, int r, int c, int plane) {
#if CONFIG_MULTITHREAD
  AV1LrSync *const loop_res_sync = (AV1LrSync *)lr_sync;
  const int nsync = loop_res_sync->sync_range;

  if (r && !(c & (nsync - 1))) {
    pthread_mutex_t *const mutex = &loop_res_sync->mutex_[plane][r - 1];
    pthread_mutex_lock(mutex);

    while (c > loop_res_sync->cur_sb_col[plane][r - 1] - nsync) {
      pthread_cond_wait(&loop_res_sync->cond_[plane][r - 1], mutex);
    }
    pthread_mutex_unlock(mutex);
  }
#else
  (void)lr_sync;
  (void)r;
  (void)c;
  (void)plane;
#endif  // CONFIG_MULTITHREAD
}